

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-slays.c
# Opt level: O0

void copy_brands(_Bool **dest,_Bool *source)

{
  int iVar1;
  _Bool *p_Var2;
  int local_20;
  int local_1c;
  wchar_t j;
  wchar_t i;
  _Bool *source_local;
  _Bool **dest_local;
  
  if (source != (_Bool *)0x0) {
    if (*dest == (_Bool *)0x0) {
      p_Var2 = (_Bool *)mem_zalloc((ulong)z_info->brand_max);
      *dest = p_Var2;
    }
    for (local_1c = 0; local_1c < (int)(uint)z_info->brand_max; local_1c = local_1c + 1) {
      (*dest)[local_1c] = ((*dest)[local_1c] & 1U) != 0 || (source[local_1c] & 1U) != 0;
    }
    for (local_1c = 0; local_1c < (int)(uint)z_info->brand_max; local_1c = local_1c + 1) {
      for (local_20 = 0; local_20 < local_1c; local_20 = local_20 + 1) {
        if (((((*dest)[local_1c] & 1U) != 0) && (((*dest)[local_20] & 1U) != 0)) &&
           (iVar1 = strcmp(brands[local_1c].name,brands[local_20].name), iVar1 == 0)) {
          if (brands[local_1c].multiplier < brands[local_20].multiplier) {
            (*dest)[local_1c] = false;
          }
          else {
            (*dest)[local_20] = false;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void copy_brands(bool **dest, bool *source)
{
	int i, j;

	/* Check structures */
	if (!source) return;
	if (!(*dest))
		*dest = mem_zalloc(z_info->brand_max * sizeof(bool));

	/* Copy */
	for (i = 0; i < z_info->brand_max; i++)
		(*dest)[i] |= source[i];

	/* Check for duplicates */
	for (i = 0; i < z_info->brand_max; i++) {
		for (j = 0; j < i; j++) {
			if ((*dest)[i] && (*dest)[j] &&
				streq(brands[i].name, brands[j].name)) {
				if (brands[i].multiplier < brands[j].multiplier) {
					(*dest)[i] = false;
				} else {
					(*dest)[j] = false;
				}
			}
		}
	}
}